

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O2

LY_ERR json_print_node(jsonpr_ctx *pctx,lyd_node *node)

{
  uint16_t uVar1;
  ushort uVar2;
  long lVar3;
  lyd_node *plVar4;
  long lVar5;
  long lVar6;
  ly_bool lVar7;
  LY_ERR LVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint32_t *opts;
  lys_module *plVar12;
  ulong uVar13;
  lys_module *plVar14;
  char *pcVar15;
  lyd_node_opaq *plVar16;
  ly_out *out;
  char cVar17;
  char *pcVar18;
  lyd_node_opaq *node_00;
  bool bVar19;
  lys_module *local_48;
  lyd_node *local_40;
  uint32_t local_34;
  
  lVar7 = lyd_node_should_print(node,pctx->options);
  if (lVar7 == '\0') {
    lVar7 = json_print_array_is_last_inst(pctx,node);
    if (lVar7 == '\0') {
      return LY_SUCCESS;
    }
    json_print_array_close(pctx);
    return LY_SUCCESS;
  }
  if (node->schema == (lysc_node *)0x0) {
    uVar9 = 0;
    uVar11 = *(uint *)&node[1].meta;
    if (*(uint *)&node[1].meta == 0x3f3) {
      uVar11 = uVar9;
    }
    if ((uVar11 & 0x180) == 0) {
LAB_0013af27:
      cVar17 = (char)uVar9;
      LVar8 = json_print_member2(pctx,pctx->parent,*(LY_VALUE_FORMAT *)((long)&node[1].meta + 4),
                                 (ly_opaq_name *)&node[1].schema,'\0');
      if (LVar8 != LY_SUCCESS) {
        return LVar8;
      }
      if (((uVar11 & 0x180) != 0) && (LVar8 = json_print_array_open(pctx,node), LVar8 != LY_SUCCESS)
         ) {
        return LVar8;
      }
      if ((uVar11 >> 8 & 1) != 0) {
        uVar13 = 0;
        if ((pctx->options & 2) == 0) {
          uVar13 = (ulong)((uint)pctx->level * 2);
        }
        ly_print_(pctx->out,"%*s",uVar13,"");
      }
    }
    else {
      if (node->prev->next == (lyd_node *)0x0) {
        bVar19 = false;
      }
      else {
        iVar10 = matching_node(node->prev,node);
        bVar19 = iVar10 != 0;
      }
      if (node->next == (lyd_node *)0x0) {
        uVar9 = 0;
      }
      else {
        iVar10 = matching_node(node,node->next);
        uVar9 = (uint)(iVar10 != 0);
      }
      cVar17 = (char)uVar9;
      if (!bVar19) goto LAB_0013af27;
      if ((uVar11 >> 8 & 1) != 0) {
        uVar13 = 0;
        pcVar18 = "";
        if ((pctx->options & 2) == 0) {
          pcVar18 = "\n";
          uVar13 = (ulong)((uint)pctx->level * 2);
        }
        ly_print_(pctx->out,",%s%*s",pcVar18,uVar13,"");
      }
    }
    if (((uVar11 & 0x280) == 0) &&
       (lVar3._0_4_ = node[1].hash, lVar3._4_4_ = node[1].flags, lVar3 == 0)) {
      if ((uVar11 & 0x40) == 0) {
        if ((char)((uVar11 & 0x10) >> 4) == '\0' && (uVar11 & 0x22) != 0) {
          ly_print_(pctx->out,"%s");
        }
        else {
          json_print_string(pctx->out,(char *)node[1].prev);
        }
      }
      else {
        ly_print_(pctx->out,"[null]");
      }
      pctx->level_printed = pctx->level;
      if ((uVar11 >> 8 & 1) == 0) {
        json_print_attributes(pctx,node,'\0');
      }
      else if ((pctx->first_leaflist == (lyd_node *)0x0) &&
              (lVar5._0_4_ = node[2].hash, lVar5._4_4_ = node[2].flags, lVar5 != 0)) {
        pctx->first_leaflist = node;
      }
    }
    else {
      LVar8 = json_print_inner(pctx,node);
      if (LVar8 != LY_SUCCESS) {
        return LVar8;
      }
      pctx->level_printed = pctx->level;
    }
    if ((uVar11 & 0x180) != 0 && cVar17 == '\0') goto LAB_0013b39a;
  }
  else {
    uVar1 = node->schema->nodetype;
    if (uVar1 == 1) {
LAB_0013ad4f:
      json_print_member(pctx,node,'\0');
      LVar8 = json_print_inner(pctx,node);
      if (LVar8 != LY_SUCCESS) {
        return LVar8;
      }
    }
    else {
      if (uVar1 == 4) {
        json_print_member(pctx,node,'\0');
        if (node->schema == (lysc_node *)0x0) {
          plVar12 = (lys_module *)&node[2].schema;
          plVar14 = _DAT_00000008;
        }
        else {
          plVar12 = node->schema->module;
          plVar14 = plVar12;
        }
        LVar8 = json_print_value(pctx,plVar12->ctx,(lyd_value *)(node + 1),plVar14);
        if (LVar8 != LY_SUCCESS) {
          return LVar8;
        }
        goto switchD_0013b0ba_default;
      }
      if ((uVar1 != 8) && (uVar1 != 0x10)) {
        if ((uVar1 != 0x20) && (uVar1 != 0x60)) {
          if (((uVar1 != 0x100) && (uVar1 != 0x400)) && (uVar1 != 0x200)) {
            ly_log(pctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
                   ,0x3fe);
            return LY_EMEM;
          }
          goto LAB_0013ad4f;
        }
        json_print_member(pctx,node,'\0');
        local_34 = 0;
        uVar2 = node->schema->nodetype;
        if ((uVar2 & 0x60) == 0) {
          __assert_fail("any->schema->nodetype & LYD_NODE_ANY",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
                        ,0x244,
                        "LY_ERR json_print_any_content(struct jsonpr_ctx *, struct lyd_node_any *)")
          ;
        }
        iVar10 = *(int *)&node[1].schema;
        if (uVar2 == 0x60) {
          if (iVar10 != 0) {
            ly_log(pctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
                   ,0x247);
            return LY_EINT;
          }
switchD_0013b0ba_caseD_0:
          pcVar18 = "";
          if ((pctx->options & 2) == 0) {
            pcVar18 = "\n";
          }
          ly_print_(pctx->out,"{%s",pcVar18);
          pctx->level = pctx->level + 1;
          plVar4 = pctx->parent;
          uVar11 = pctx->options;
          pctx->parent = node;
          pctx->options = uVar11 & 0xfffffffe;
          for (local_40 = node + 1; local_40 = *(lyd_node **)local_40, local_40 != (lyd_node *)0x0;
              local_40 = (lyd_node *)&local_40->next) {
            LVar8 = json_print_node(pctx,local_40);
            if (LVar8 != LY_SUCCESS) {
              pctx->level = pctx->level - 1;
              return LVar8;
            }
          }
          pctx->parent = plVar4;
          pctx->options = uVar11;
          uVar9 = *(int *)&pctx->level - 1;
          pctx->level = (uint16_t)uVar9;
          out = pctx->out;
          if ((uVar11 & 2) == 0) {
            ly_print_(out,"\n%*s}",(ulong)((uVar9 & 0xffff) * 2),"");
          }
          else {
            pcVar18 = "}";
LAB_0013b345:
            ly_print_(out,pcVar18);
          }
        }
        else {
          if (iVar10 == 4) {
            opts = ly_temp_log_options(&local_34);
            LVar8 = lyd_parse_data_mem(pctx->ctx,*(char **)(node + 1),LYD_LYB,0x70000,0,&local_40);
            if (LVar8 == LY_SUCCESS) {
              free(*(void **)(node + 1));
              *(lyd_node **)(node + 1) = local_40;
              *(undefined4 *)&node[1].schema = 0;
            }
            ly_temp_log_options(opts);
            iVar10 = *(int *)&node[1].schema;
          }
          switch(iVar10) {
          case 0:
            goto switchD_0013b0ba_caseD_0;
          case 1:
          case 2:
            if (*(char **)(node + 1) != (char *)0x0) {
              json_print_string(pctx->out,*(char **)(node + 1));
              break;
            }
LAB_0013b31f:
            out = pctx->out;
            if (node->schema->nodetype == 0x20) {
              pcVar18 = "null";
            }
            else {
              pcVar18 = "{}";
            }
            goto LAB_0013b345;
          case 3:
            lVar6._0_4_ = node[1].hash;
            lVar6._4_4_ = node[1].flags;
            if (lVar6 == 0) goto LAB_0013b31f;
            ly_print_(pctx->out,"%s");
            break;
          case 4:
            ly_log(pctx->ctx,LY_LLWRN,LY_SUCCESS,
                   "Unable to print anydata content (type %d) as JSON.",4);
          }
        }
switchD_0013b0ba_default:
        pctx->level_printed = pctx->level;
        json_print_attributes(pctx,node,'\0');
        goto LAB_0013b3a2;
      }
      iVar10 = is_open_array(pctx,node);
      if (iVar10 == 0) {
        json_print_member(pctx,node,'\0');
        LVar8 = json_print_array_open(pctx,node);
        if (LVar8 != LY_SUCCESS) {
          return LVar8;
        }
        if (node->schema->nodetype == 8) {
          uVar13 = 0;
          if ((pctx->options & 2) == 0) {
            uVar13 = (ulong)((uint)pctx->level * 2);
          }
          ly_print_(pctx->out,"%*s",uVar13,"");
        }
      }
      else if (node->schema->nodetype == 8) {
        uVar13 = 0;
        pcVar18 = "";
        if ((pctx->options & 2) == 0) {
          pcVar18 = "\n";
          uVar13 = (ulong)((uint)pctx->level * 2);
        }
        ly_print_(pctx->out,",%s%*s",pcVar18,uVar13,"");
      }
      uVar1 = node->schema->nodetype;
      if (uVar1 == 8) {
        plVar12 = node->schema->module;
        LVar8 = json_print_value(pctx,plVar12->ctx,(lyd_value *)(node + 1),plVar12);
        if (LVar8 != LY_SUCCESS) {
          return LVar8;
        }
        if (pctx->first_leaflist == (lyd_node *)0x0) {
          if (((pctx->options & 0xc0) == 0 || (node->flags & 1) == 0) &&
             (((pctx->options & 0x40) == 0 || (lVar7 = lyd_is_default(node), lVar7 == '\0')))) {
LAB_0013b37b:
            lVar7 = node_has_printable_meta(node);
            if (lVar7 == '\0') goto LAB_0013b38b;
          }
          else {
            if (node->schema == (lysc_node *)0x0) {
              plVar12 = (lys_module *)&node[2].schema;
            }
            else {
              plVar12 = node->schema->module;
            }
            plVar12 = ly_ctx_get_module_implemented(plVar12->ctx,"ietf-netconf-with-defaults");
            if (plVar12 == (lys_module *)0x0) goto LAB_0013b37b;
          }
          pctx->first_leaflist = node;
        }
      }
      else {
        if (uVar1 != 0x10) {
          __assert_fail("node->schema->nodetype == LYS_LEAFLIST",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
                        ,0x332,
                        "LY_ERR json_print_leaf_list(struct jsonpr_ctx *, const struct lyd_node *)")
          ;
        }
        LVar8 = json_print_inner(pctx,node);
        if (LVar8 != LY_SUCCESS) {
          return LVar8;
        }
      }
LAB_0013b38b:
      lVar7 = json_print_array_is_last_inst(pctx,node);
      if (lVar7 == '\0') goto LAB_0013b3a2;
LAB_0013b39a:
      json_print_array_close(pctx);
    }
  }
LAB_0013b3a2:
  pctx->level_printed = pctx->level;
  if (pctx->first_leaflist == (lyd_node *)0x0) {
    return LY_SUCCESS;
  }
  iVar10 = matching_node(node->next,pctx->first_leaflist);
  if (iVar10 != 0) {
    return LY_SUCCESS;
  }
  if ((lyd_node_opaq *)pctx->first_leaflist == (lyd_node_opaq *)0x0) {
    __assert_fail("pctx->first_leaflist",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
                  ,0x358,"LY_ERR json_print_meta_attr_leaflist(struct jsonpr_ctx *)");
  }
  if ((pctx->options & 0xc0) == 0) {
    local_48 = (lys_module *)0x0;
    plVar16 = (lyd_node_opaq *)pctx->first_leaflist;
  }
  else {
    local_48 = ly_ctx_get_module_implemented(pctx->ctx,"ietf-netconf-with-defaults");
    plVar16 = (lyd_node_opaq *)pctx->first_leaflist;
  }
  do {
    node_00 = plVar16;
    plVar16 = (lyd_node_opaq *)(node_00->field_0).node.prev;
    if ((plVar16->field_0).node.next == (lyd_node *)0x0) break;
    iVar10 = matching_node((lyd_node *)node_00,(lyd_node *)plVar16);
  } while (iVar10 != 0);
  if ((node_00->field_0).node.schema == (lysc_node *)0x0) {
    LVar8 = json_print_member2(pctx,(lyd_node *)(node_00->field_0).node.parent,node_00->format,
                               &node_00->name,'\x01');
    plVar16 = node_00;
    if (LVar8 != LY_SUCCESS) goto LAB_0013b61e;
  }
  else {
    json_print_member(pctx,(lyd_node *)node_00,'\x01');
    plVar16 = (lyd_node_opaq *)0x0;
  }
  pcVar18 = "\n";
  pcVar15 = "";
  if ((pctx->options & 2) == 0) {
    pcVar15 = "\n";
  }
  ly_print_(pctx->out,"[%s",pcVar15);
  uVar11 = *(int *)&pctx->level + 1;
  pctx->level = (uint16_t)uVar11;
  for (; node_00 != (lyd_node_opaq *)0x0; node_00 = (lyd_node_opaq *)(node_00->field_0).node.next) {
    if ((ushort)uVar11 <= pctx->level_printed) {
      pcVar15 = "";
      if ((pctx->options & 2) == 0) {
        pcVar15 = "\n";
      }
      ly_print_(pctx->out,",%s",pcVar15);
    }
    if (((node_00->field_0).node.schema == (lysc_node *)0x0) ||
       ((plVar12 = local_48,
        (undefined1  [56])((undefined1  [56])node_00->field_0 & (undefined1  [56])0x100000000) ==
        (undefined1  [56])0x0 &&
        (((pctx->options & 0x40) == 0 ||
         (lVar7 = lyd_is_default((lyd_node *)node_00), lVar7 == '\0')))))) {
      plVar12 = (lys_module *)0x0;
    }
    if ((((node_00->field_0).node.schema == (lysc_node *)0x0) ||
        ((lVar7 = node_has_printable_meta((lyd_node *)node_00), lVar7 == '\0' &&
         (plVar12 == (lys_module *)0x0)))) &&
       ((plVar16 == (lyd_node_opaq *)0x0 || (plVar16->attr == (lyd_attr *)0x0)))) {
      uVar13 = 0;
      if ((pctx->options & 2) == 0) {
        uVar13 = (ulong)((uint)pctx->level * 2);
      }
      ly_print_(pctx->out,"%*snull",uVar13,"");
    }
    else {
      uVar13 = 0;
      pcVar15 = "{";
      if ((pctx->options & 2) == 0) {
        uVar13 = (ulong)((uint)pctx->level * 2);
        pcVar15 = "{\n";
      }
      ly_print_(pctx->out,"%*s%s",uVar13,"",pcVar15);
      pctx->level = pctx->level + 1;
      if ((node_00->field_0).node.schema == (lysc_node *)0x0) {
        json_print_attribute(pctx,node_00);
      }
      else {
        LVar8 = json_print_metadata(pctx,(lyd_node *)node_00,plVar12);
        if (LVar8 != LY_SUCCESS) goto LAB_0013b61e;
      }
      uVar11 = *(int *)&pctx->level - 1;
      pctx->level = (uint16_t)uVar11;
      bVar19 = (pctx->options & 2) == 0;
      pcVar15 = "";
      if (bVar19) {
        pcVar15 = "\n";
      }
      uVar11 = (uVar11 & 0xffff) * 2;
      if (!bVar19) {
        uVar11 = 0;
      }
      ly_print_(pctx->out,"%s%*s}",pcVar15,(ulong)uVar11,"");
    }
    pctx->level_printed = pctx->level;
    iVar10 = matching_node((lyd_node *)node_00,(node_00->field_0).node.next);
    if (iVar10 == 0) {
      uVar11 = (uint)pctx->level;
      break;
    }
    uVar11 = (uint)pctx->level;
  }
  pctx->level = (uint16_t)(uVar11 - 1);
  uVar11 = (uVar11 - 1 & 0xffff) * 2;
  if ((pctx->options & 2) != 0) {
    pcVar18 = "";
    uVar11 = 0;
  }
  ly_print_(pctx->out,"%s%*s]",pcVar18,(ulong)uVar11,"");
  pctx->level_printed = pctx->level;
LAB_0013b61e:
  pctx->first_leaflist = (lyd_node *)0x0;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
json_print_node(struct jsonpr_ctx *pctx, const struct lyd_node *node)
{
    if (!lyd_node_should_print(node, pctx->options)) {
        if (json_print_array_is_last_inst(pctx, node)) {
            json_print_array_close(pctx);
        }
        return LY_SUCCESS;
    }

    if (!node->schema) {
        LY_CHECK_RET(json_print_opaq(pctx, (const struct lyd_node_opaq *)node));
    } else {
        switch (node->schema->nodetype) {
        case LYS_RPC:
        case LYS_ACTION:
        case LYS_NOTIF:
        case LYS_CONTAINER:
            LY_CHECK_RET(json_print_container(pctx, node));
            break;
        case LYS_LEAF:
            LY_CHECK_RET(json_print_leaf(pctx, node));
            break;
        case LYS_LEAFLIST:
        case LYS_LIST:
            LY_CHECK_RET(json_print_leaf_list(pctx, node));
            break;
        case LYS_ANYDATA:
        case LYS_ANYXML:
            LY_CHECK_RET(json_print_any(pctx, node));
            break;
        default:
            LOGINT(pctx->ctx);
            return EXIT_FAILURE;
        }
    }

    pctx->level_printed = pctx->level;

    if (pctx->first_leaflist && !matching_node(node->next, pctx->first_leaflist)) {
        json_print_meta_attr_leaflist(pctx);
        pctx->first_leaflist = NULL;
    }

    return LY_SUCCESS;
}